

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# InputBuffer.cpp
# Opt level: O1

string * __thiscall
antlr::InputBuffer::getLAChars_abi_cxx11_(string *__return_storage_ptr__,InputBuffer *this)

{
  uint uVar1;
  
  (__return_storage_ptr__->_M_dataplus)._M_p = (pointer)&__return_storage_ptr__->field_2;
  __return_storage_ptr__->_M_string_length = 0;
  (__return_storage_ptr__->field_2)._M_local_buf[0] = '\0';
  uVar1 = this->markerOffset;
  if ((ulong)uVar1 <
      ((long)(this->queue).storage.super__Vector_base<int,_std::allocator<int>_>._M_impl.
             super__Vector_impl_data._M_finish -
       (long)(this->queue).storage.super__Vector_base<int,_std::allocator<int>_>._M_impl.
             super__Vector_impl_data._M_start >> 2) - (this->queue).m_offset) {
    do {
      uVar1 = uVar1 + 1;
      std::__cxx11::string::push_back((char)__return_storage_ptr__);
    } while ((ulong)uVar1 <
             ((long)(this->queue).storage.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                    super__Vector_impl_data._M_finish -
              (long)(this->queue).storage.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                    super__Vector_impl_data._M_start >> 2) - (this->queue).m_offset);
  }
  return __return_storage_ptr__;
}

Assistant:

string InputBuffer::getLAChars( void ) const
{
	ANTLR_USE_NAMESPACE(std)string ret;

	for(unsigned int i = markerOffset; i < queue.entries(); i++)
		ret += queue.elementAt(i);

	return ret;
}